

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O2

void __thiscall aiScene::~aiScene(aiScene *this)

{
  aiNode *this_00;
  aiMesh *this_01;
  aiMaterial *this_02;
  aiAnimation *this_03;
  aiTexture *this_04;
  uint uVar1;
  uint a_4;
  uint a;
  ulong uVar2;
  
  this_00 = this->mRootNode;
  if (this_00 != (aiNode *)0x0) {
    aiNode::~aiNode(this_00);
  }
  operator_delete(this_00);
  uVar1 = this->mNumMeshes;
  if ((uVar1 != 0) && (this->mMeshes != (aiMesh **)0x0)) {
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      this_01 = this->mMeshes[uVar2];
      if (this_01 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(this_01);
      }
      operator_delete(this_01);
      uVar1 = this->mNumMeshes;
    }
  }
  if (this->mMeshes != (aiMesh **)0x0) {
    operator_delete__(this->mMeshes);
  }
  uVar1 = this->mNumMaterials;
  if ((uVar1 != 0) && (this->mMaterials != (aiMaterial **)0x0)) {
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      this_02 = this->mMaterials[uVar2];
      if (this_02 != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial(this_02);
      }
      operator_delete(this_02);
      uVar1 = this->mNumMaterials;
    }
  }
  if (this->mMaterials != (aiMaterial **)0x0) {
    operator_delete__(this->mMaterials);
  }
  uVar1 = this->mNumAnimations;
  if ((uVar1 != 0) && (this->mAnimations != (aiAnimation **)0x0)) {
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      this_03 = this->mAnimations[uVar2];
      if (this_03 != (aiAnimation *)0x0) {
        aiAnimation::~aiAnimation(this_03);
      }
      operator_delete(this_03);
      uVar1 = this->mNumAnimations;
    }
  }
  if (this->mAnimations != (aiAnimation **)0x0) {
    operator_delete__(this->mAnimations);
  }
  uVar1 = this->mNumTextures;
  if ((uVar1 != 0) && (this->mTextures != (aiTexture **)0x0)) {
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      this_04 = this->mTextures[uVar2];
      if (this_04 != (aiTexture *)0x0) {
        aiTexture::~aiTexture(this_04);
      }
      operator_delete(this_04);
      uVar1 = this->mNumTextures;
    }
  }
  if (this->mTextures != (aiTexture **)0x0) {
    operator_delete__(this->mTextures);
  }
  uVar1 = this->mNumLights;
  if ((uVar1 != 0) && (this->mLights != (aiLight **)0x0)) {
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      operator_delete(this->mLights[uVar2]);
      uVar1 = this->mNumLights;
    }
  }
  if (this->mLights != (aiLight **)0x0) {
    operator_delete__(this->mLights);
  }
  uVar1 = this->mNumCameras;
  if ((uVar1 != 0) && (this->mCameras != (aiCamera **)0x0)) {
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      operator_delete(this->mCameras[uVar2]);
      uVar1 = this->mNumCameras;
    }
  }
  if (this->mCameras != (aiCamera **)0x0) {
    operator_delete__(this->mCameras);
  }
  aiMetadata::Dealloc(this->mMetaData);
  this->mMetaData = (aiMetadata *)0x0;
  operator_delete(this->mPrivate);
  return;
}

Assistant:

ASSIMP_API aiScene::~aiScene() {
    // delete all sub-objects recursively
    delete mRootNode;

    // To make sure we won't crash if the data is invalid it's
    // much better to check whether both mNumXXX and mXXX are
    // valid instead of relying on just one of them.
    if (mNumMeshes && mMeshes)
        for( unsigned int a = 0; a < mNumMeshes; a++)
            delete mMeshes[a];
    delete [] mMeshes;

    if (mNumMaterials && mMaterials) {
        for (unsigned int a = 0; a < mNumMaterials; ++a ) {
            delete mMaterials[ a ];
        }
    }
    delete [] mMaterials;

    if (mNumAnimations && mAnimations)
        for( unsigned int a = 0; a < mNumAnimations; a++)
            delete mAnimations[a];
    delete [] mAnimations;

    if (mNumTextures && mTextures)
        for( unsigned int a = 0; a < mNumTextures; a++)
            delete mTextures[a];
    delete [] mTextures;

    if (mNumLights && mLights)
        for( unsigned int a = 0; a < mNumLights; a++)
            delete mLights[a];
    delete [] mLights;

    if (mNumCameras && mCameras)
        for( unsigned int a = 0; a < mNumCameras; a++)
            delete mCameras[a];
    delete [] mCameras;

    aiMetadata::Dealloc(mMetaData);
    mMetaData = nullptr;

    delete static_cast<Assimp::ScenePrivateData*>( mPrivate );
}